

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *db_00;
  Db *__s;
  Schema *pSVar2;
  char *pcVar3;
  sqlite3_context *in_RDI;
  char **unaff_retaddr;
  char **in_stack_00000008;
  int iDb;
  Pager *pPager;
  char *z;
  sqlite3_vfs *pVfs;
  char *zErrDyn;
  Db *aNew;
  uint flags;
  char *zErr;
  char *zPath;
  char *zFile;
  char *zName;
  sqlite3 *db;
  int rc;
  int i;
  undefined4 in_stack_00000078;
  sqlite3_vfs *in_stack_00000088;
  Btree *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  sqlite3 *in_stack_ffffffffffffff88;
  sqlite3 *in_stack_ffffffffffffff90;
  char *local_60;
  Db *local_58;
  uchar *local_38;
  uchar *local_30;
  int local_20;
  int local_1c;
  
  local_20 = 0;
  db_00 = sqlite3_context_db_handle(in_RDI);
  local_60 = (char *)0x0;
  local_38 = sqlite3_value_text((sqlite3_value *)0x1a749a);
  local_30 = sqlite3_value_text((sqlite3_value *)0x1a74ad);
  if (local_38 == (uchar *)0x0) {
    local_38 = "";
  }
  if (local_30 == (uchar *)0x0) {
    local_30 = "";
  }
  if (db_00->nDb < db_00->aLimit[7] + 2) {
    if (db_00->autoCommit == '\0') {
      local_60 = sqlite3MPrintf(db_00,"cannot ATTACH database within transaction");
    }
    else {
      for (local_1c = 0; local_1c < db_00->nDb; local_1c = local_1c + 1) {
        in_stack_ffffffffffffff90 = (sqlite3 *)db_00->aDb[local_1c].zName;
        iVar1 = sqlite3_stricmp((char *)in_stack_ffffffffffffff90,(char *)local_30);
        if (iVar1 == 0) {
          local_60 = sqlite3MPrintf(db_00,"database %s is already in use",local_30);
          goto LAB_001a7a12;
        }
      }
      if (db_00->aDb == db_00->aDbStatic) {
        local_58 = (Db *)sqlite3DbMallocRaw(in_stack_ffffffffffffff88,
                                            CONCAT44(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80));
        if (local_58 == (Db *)0x0) {
          return;
        }
        memcpy(local_58,db_00->aDb,0x40);
      }
      else {
        local_58 = (Db *)sqlite3DbRealloc(in_stack_ffffffffffffff88,
                                          (void *)CONCAT44(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80),
                                          (u64)in_stack_ffffffffffffff78);
        if (local_58 == (Db *)0x0) {
          return;
        }
      }
      db_00->aDb = local_58;
      __s = db_00->aDb + db_00->nDb;
      memset(__s,0,0x20);
      iVar1 = sqlite3ParseUri(zErrDyn,(char *)pVfs,(uint *)z,&pPager->pVfs,in_stack_00000008,
                              unaff_retaddr);
      if (iVar1 != 0) {
        if (iVar1 == 7) {
          db_00->mallocFailed = '\x01';
        }
        sqlite3_result_error
                  ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char *)in_stack_ffffffffffffff78,0);
        sqlite3_free((void *)0x1a76f9);
        return;
      }
      local_20 = sqlite3BtreeOpen(in_stack_00000088,(char *)context,
                                  (sqlite3 *)CONCAT44(NotUsed,in_stack_00000078),(Btree **)argv,i,rc
                                 );
      sqlite3_free((void *)0x1a773e);
      db_00->nDb = db_00->nDb + 1;
      if (local_20 == 0x13) {
        local_20 = 1;
        local_60 = sqlite3MPrintf(db_00,"database is already attached");
      }
      else if (local_20 == 0) {
        pSVar2 = sqlite3SchemaGet((sqlite3 *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  in_stack_ffffffffffffff78);
        iVar1 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        __s->pSchema = pSVar2;
        if (__s->pSchema == (Schema *)0x0) {
          local_20 = 7;
        }
        else if ((__s->pSchema->file_format != '\0') && (__s->pSchema->enc != db_00->enc)) {
          local_60 = sqlite3MPrintf(db_00,
                                    "attached databases must use the same text encoding as main database"
                                   );
          local_20 = 1;
        }
        sqlite3BtreeEnter((Btree *)0x1a7814);
        in_stack_ffffffffffffff88 = (sqlite3 *)sqlite3BtreePager(__s->pBt);
        sqlite3PagerLockingMode
                  ((Pager *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        in_stack_ffffffffffffff78 = __s->pBt;
        sqlite3BtreeSecureDelete(in_stack_ffffffffffffff78,0);
        sqlite3BtreeSecureDelete(in_stack_ffffffffffffff78,0);
        sqlite3BtreeSetPagerFlags
                  ((Btree *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        sqlite3BtreeLeave((Btree *)0x1a7893);
      }
      __s->safety_level = '\x03';
      pcVar3 = sqlite3DbStrDup(in_stack_ffffffffffffff88,
                               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                              );
      __s->zName = pcVar3;
      if ((local_20 == 0) && (__s->zName == (char *)0x0)) {
        local_20 = 7;
      }
      if (local_20 == 0) {
        sqlite3BtreeEnterAll
                  ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        local_20 = sqlite3Init(in_stack_ffffffffffffff90,(char **)in_stack_ffffffffffffff88);
        sqlite3BtreeLeaveAll
                  ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
      if (local_20 == 0) {
        return;
      }
      in_stack_ffffffffffffff84 = db_00->nDb + -1;
      if (db_00->aDb[in_stack_ffffffffffffff84].pBt != (Btree *)0x0) {
        sqlite3BtreeClose((Btree *)in_stack_ffffffffffffff90);
        db_00->aDb[in_stack_ffffffffffffff84].pBt = (Btree *)0x0;
        db_00->aDb[in_stack_ffffffffffffff84].pSchema = (Schema *)0x0;
      }
      sqlite3ResetAllSchemasOfConnection
                ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      db_00->nDb = in_stack_ffffffffffffff84;
      if ((local_20 == 7) || (local_20 == 0xc0a)) {
        db_00->mallocFailed = '\x01';
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
        local_60 = sqlite3MPrintf(db_00,"out of memory");
      }
      else if (local_60 == (char *)0x0) {
        local_60 = sqlite3MPrintf(db_00,"unable to open database: %s",local_38);
      }
    }
  }
  else {
    local_60 = sqlite3MPrintf(db_00,"too many attached databases - max %d",
                              (ulong)(uint)db_00->aLimit[7]);
  }
LAB_001a7a12:
  if (local_60 != (char *)0x0) {
    sqlite3_result_error
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_stack_ffffffffffffff78,0);
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff78);
  }
  if (local_20 != 0) {
    sqlite3_result_error_code
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRaw(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  aNew = &db->aDb[db->nDb];
  memset(aNew, 0, sizeof(*aNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &aNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    aNew->pSchema = sqlite3SchemaGet(db, aNew->pBt);
    if( !aNew->pSchema ){
      rc = SQLITE_NOMEM;
    }else if( aNew->pSchema->file_format && aNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(aNew->pBt);
    pPager = sqlite3BtreePager(aNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(aNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(aNew->pBt, 3 | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(aNew->pBt);
  }
  aNew->safety_level = 3;
  aNew->zName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && aNew->zName==0 ){
    rc = SQLITE_NOMEM;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey>0 || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      db->mallocFailed = 1;
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}